

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_> *
wasm::WATParser::structtype<wasm::WATParser::ParseTypeDefsCtx>
          (MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
           *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  Lexer *this;
  undefined8 *puVar1;
  undefined1 *puVar2;
  bool bVar3;
  FieldsT *fields;
  ulong uVar4;
  undefined1 auVar5 [8];
  string_view expected;
  undefined1 local_d8 [8];
  Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
  namedFields;
  long local_90;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  undefined1 local_60 [8];
  Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
  _val;
  
  this = &ctx->in;
  expected._M_str = "struct";
  expected._M_len = 6;
  bVar3 = Lexer::takeSExprStart(this,expected);
  if (!bVar3) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
     + 0x30) = '\x01';
    return __return_storage_ptr__;
  }
  fields<wasm::WATParser::ParseTypeDefsCtx>
            ((Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
              *)local_d8,ctx);
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                     *)local_60,
                    (_Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                     *)local_d8);
  if (_val.val.
      super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
      .
      super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[0x28] == '\x01') {
    local_80 = &local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_60,
               (undefined1 *)
               (_val.val.
                super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                .
                super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                .
                super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                .
                super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                .
                super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                .
                super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                ._M_u._0_8_ + (long)local_60));
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                     .
                     super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).
      super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
      .
      super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
      .
      super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
      .
      super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
      .
      super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
      .
      super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
         = puVar1;
    if (local_80 == &local_70) {
      *puVar1 = CONCAT71(uStack_6f,local_70);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
       + 0x18) = uStack_68;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->val).
        super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
           = local_80;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                        .
                        super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                + 0x10) = CONCAT71(uStack_6f,local_70);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
     + 8) = local_78;
    local_78 = 0;
    local_70 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
     + 0x30) = '\x02';
    local_80 = &local_70;
    std::__detail::__variant::
    _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                         *)local_60);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                         *)local_60);
    bVar3 = Lexer::takeRParen(this);
    if (bVar3) {
      fields = (FieldsT *)0x0;
      if (namedFields.val.
          super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
          .
          super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          .
          super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          .
          super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          .
          super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[0x28] == '\0') {
        fields = (FieldsT *)local_d8;
      }
      TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeStruct
                ((StructT *)local_60,&ctx->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,
                 fields);
      std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>::pair
                ((pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct> *)
                 __return_storage_ptr__,
                 (pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct> *)
                 local_60);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
       + 0x30) = '\0';
      if (_val.val.
          super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
          .
          super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          .
          super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          .
          super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          .
          super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
          ._M_u._16_8_ != 0) {
        operator_delete((void *)_val.val.
                                super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                                .
                                super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                                .
                                super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                                .
                                super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                                .
                                super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                                ._M_u._16_8_,
                        _val.val.
                        super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        ._M_u._32_8_ -
                        _val.val.
                        super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                        ._M_u._16_8_);
      }
      if (local_60 == (undefined1  [8])0x0) goto LAB_00bcf3d3;
      uVar4 = CONCAT71(_val.val.
                       super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       ._M_u._9_7_,
                       _val.val.
                       super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       ._M_u._M_first._M_storage._M_storage[8]) - (long)local_60;
      auVar5 = local_60;
    }
    else {
      namedFields.val.
      super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
      .
      super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      ._48_8_ = &stack0xffffffffffffff70;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 ((long)&namedFields.val.
                         super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                 + 0x30),"expected end of struct definition","");
      Lexer::err((Err *)local_60,this,
                 (string *)
                 ((long)&namedFields.val.
                         super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                 + 0x30));
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).
        super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
        .
        super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
           = puVar1;
      puVar2 = (undefined1 *)
               ((long)&_val.val.
                       super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
               + 8);
      if (local_60 == (undefined1  [8])puVar2) {
        *puVar1 = CONCAT71(_val.val.
                           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           ._M_u._9_7_,
                           _val.val.
                           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           .
                           super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                           ._M_u._M_first._M_storage._M_storage[8]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
         + 0x18) = _val.val.
                   super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                   ._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).
          super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
          .
          super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
          .
          super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
          .
          super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
          .
          super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
          .
          super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
             = local_60;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                          .
                          super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
                  + 0x10) =
             CONCAT71(_val.val.
                      super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      ._M_u._9_7_,
                      _val.val.
                      super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                      ._M_u._M_first._M_storage._M_storage[8]);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
       + 8) = _val.val.
              super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
              .
              super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
              .
              super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
              .
              super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
              .
              super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
              .
              super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
              ._M_u._0_8_;
      _val.val.
      super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
      .
      super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      ._M_u._0_8_ = 0;
      _val.val.
      super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
      .
      super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      .
      super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[8] = '\0';
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_wasm::Struct>,_wasm::None,_wasm::Err>
       + 0x30) = '\x02';
      local_60 = (undefined1  [8])puVar2;
      if ((long *)namedFields.val.
                  super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
                  ._48_8_ == &stack0xffffffffffffff70) goto LAB_00bcf3d3;
      uVar4 = local_90 + 1;
      auVar5 = (undefined1  [8])
               namedFields.val.
               super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
               .
               super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
               .
               super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
               .
               super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
               .
               super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
               .
               super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
               ._48_8_;
    }
    operator_delete((void *)auVar5,uVar4);
  }
LAB_00bcf3d3:
  std::__detail::__variant::
  _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
                       *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::StructT> structtype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("struct"sv)) {
    return {};
  }
  auto namedFields = fields(ctx);
  CHECK_ERR(namedFields);
  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of struct definition");
  }

  return ctx.makeStruct(*namedFields);
}